

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O1

Token * __thiscall wabt::Token::operator=(Token *this,Token *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *psVar3;
  size_type *psVar4;
  TokenType TVar5;
  undefined1 *puVar6;
  pointer pcVar7;
  char *pcVar8;
  size_type sVar9;
  undefined8 uVar10;
  size_type sVar11;
  
  Destroy(this);
  pcVar8 = (other->loc).filename.data_;
  sVar9 = (other->loc).filename.size_;
  uVar10 = *(undefined8 *)((long)&(other->loc).field_1 + 8);
  (this->loc).field_1.field_1.offset = (other->loc).field_1.field_1.offset;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = uVar10;
  (this->loc).filename.data_ = pcVar8;
  (this->loc).filename.size_ = sVar9;
  TVar5 = other->token_type_;
  this->token_type_ = TVar5;
  if (TVar5 - First_Literal < 3) {
    (this->field_2).type_ = (other->field_2).type_;
    paVar1 = &(this->field_2).literal_.text.field_2;
    (this->field_2).text_._M_string_length = (size_type)paVar1;
    puVar6 = (undefined1 *)(other->field_2).text_._M_string_length;
    paVar2 = &(other->field_2).literal_.text.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6 == paVar2) {
      uVar10 = *(undefined8 *)((long)&(other->field_2).literal_.text.field_2 + 8);
      paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
      *(undefined8 *)((long)&(this->field_2).literal_.text.field_2 + 8) = uVar10;
    }
    else {
      (this->field_2).text_._M_string_length = (size_type)puVar6;
      (this->field_2).literal_.text.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    }
    (this->field_2).literal_.text._M_string_length = (other->field_2).literal_.text._M_string_length
    ;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&other->field_2 + 8) = paVar2;
    (other->field_2).literal_.text._M_string_length = 0;
    *(undefined1 *)((long)&other->field_2 + 0x18) = 0;
    goto LAB_00f65ec6;
  }
  if (0x33 < TVar5 - AtomicLoad) {
    if (TVar5 - AlignEqNat < 5) {
      psVar3 = &(this->field_2).literal_.text._M_string_length;
      *(size_type **)&this->field_2 = psVar3;
      pcVar7 = (other->field_2).text_._M_dataplus._M_p;
      psVar4 = &(other->field_2).literal_.text._M_string_length;
      if ((size_type *)pcVar7 == psVar4) {
        sVar11 = (other->field_2).literal_.text.field_2._M_allocated_capacity;
        *psVar3 = *psVar4;
        (this->field_2).literal_.text.field_2._M_allocated_capacity = sVar11;
      }
      else {
        (this->field_2).text_._M_dataplus._M_p = pcVar7;
        (this->field_2).literal_.text._M_string_length = *psVar4;
      }
      (this->field_2).text_._M_string_length = (other->field_2).text_._M_string_length;
      *(size_type **)&other->field_2 = psVar4;
      (other->field_2).text_._M_string_length = 0;
      *(undefined1 *)((long)&other->field_2 + 0x10) = 0;
      goto LAB_00f65ec6;
    }
    if (TVar5 != First_Type) goto LAB_00f65ec6;
  }
  (this->field_2).type_ = (other->field_2).type_;
LAB_00f65ec6:
  other->token_type_ = First;
  return this;
}

Assistant:

Token& Token::operator=(Token&& other) {
  Destroy();
  loc = other.loc;
  token_type_ = other.token_type_;

  if (HasLiteral()) {
    Construct(literal_, std::move(other.literal_));
  } else if (HasOpcode()) {
    Construct(opcode_, std::move(other.opcode_));
  } else if (HasText()) {
    Construct(text_, std::move(other.text_));
  } else if (HasType()) {
    Construct(type_, std::move(other.type_));
  }

  other.token_type_ = TokenType::Invalid;

  return *this;
}